

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_1b0fcc::Db::parseSimpleId(Db *this)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  NameState *in_RSI;
  
  pNVar1 = parseSourceName(this,in_RSI);
  if (pNVar1 != (Node *)0x0) {
    if (this->Last == this->First) {
      return pNVar1;
    }
    if (*this->First != 'I') {
      return pNVar1;
    }
    pNVar2 = parseTemplateArgs(this,false);
    if (pNVar2 != (Node *)0x0) {
      pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar3->K = KNameWithTemplateArgs;
      pNVar3->RHSComponentCache = No;
      pNVar3->ArrayCache = No;
      pNVar3->FunctionCache = No;
      pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d6a0;
      pNVar3[1]._vptr_Node = (_func_int **)pNVar1;
      *(Node **)&pNVar3[1].K = pNVar2;
      return pNVar3;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseSimpleId() {
  Node *SN = parseSourceName(/*NameState=*/nullptr);
  if (SN == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(SN, TA);
  }
  return SN;
}